

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

void __thiscall
banksia::ChessBoard::gen_addPawnMove
          (ChessBoard *this,vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *moveList,
          int from,int dest,bool captureOnly)

{
  Piece PVar1;
  int in_ECX;
  Piece in_RSI;
  byte in_R8B;
  Side fromSide;
  Piece movingPiece;
  Side toSide;
  undefined4 in_stack_ffffffffffffff08;
  PieceType in_stack_ffffffffffffff0c;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *in_stack_ffffffffffffff10;
  MoveFull *in_stack_ffffffffffffff18;
  Piece this_00;
  Piece in_stack_ffffffffffffff20;
  Side SStack_2c;
  Side SStack_24;
  
  PVar1 = BoardCore::getPiece((BoardCore *)
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
  SStack_24 = PVar1.side;
  PVar1 = BoardCore::getPiece((BoardCore *)
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
  SStack_2c = PVar1.side;
  if ((SStack_2c != SStack_24) && (((in_R8B & 1) == 0 || (SStack_24 != none)))) {
    if ((in_ECX < 8) || (0x37 < in_ECX)) {
      PVar1 = in_RSI;
      MoveFull::MoveFull(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,in_RSI.side,in_RSI.type
                         ,in_stack_ffffffffffffff0c);
      std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::push_back
                ((vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)PVar1,
                 (value_type *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      this_00 = in_RSI;
      MoveFull::MoveFull((MoveFull *)in_RSI,in_stack_ffffffffffffff20,PVar1.side,PVar1.type,
                         in_stack_ffffffffffffff0c);
      std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::push_back
                ((vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)PVar1,
                 (value_type *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      MoveFull::MoveFull((MoveFull *)this_00,in_RSI,PVar1.side,PVar1.type,in_stack_ffffffffffffff0c)
      ;
      std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::push_back
                ((vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)PVar1,
                 (value_type *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      MoveFull::MoveFull((MoveFull *)this_00,in_RSI,PVar1.side,PVar1.type,in_stack_ffffffffffffff0c)
      ;
      std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::push_back
                ((vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)PVar1,
                 (value_type *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    else {
      MoveFull::MoveFull(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,
                         (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                         (int)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::push_back
                (in_stack_ffffffffffffff10,
                 (value_type *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
  }
  return;
}

Assistant:

void ChessBoard::gen_addPawnMove(std::vector<MoveFull>& moveList, int from, int dest, bool captureOnly) const
{
    auto toSide = getPiece(dest).side;
    auto movingPiece = getPiece(from);
    auto fromSide = movingPiece.side;
    
    assert(movingPiece.type == PieceType::pawn);
    if (fromSide != toSide && (!captureOnly || toSide != Side::none)) {
        if (dest >= 8 && dest < 56) {
            moveList.push_back(MoveFull(movingPiece, from, dest));
        } else {
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::queen));
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::rook));
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::bishop));
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::knight));
        }
    }
}